

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  uint uVar1;
  ZSTD_DDictHashSet *pZVar2;
  ZSTD_DDict *pZVar3;
  ulong uVar4;
  uint uVar5;
  XXH64_hash_t XVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_2c;
  
  if ((dctx->refMultipleDDicts == ZSTD_rmd_refSingleDDict) ||
     (pZVar2 = dctx->ddictSet, pZVar2 == (ZSTD_DDictHashSet *)0x0)) {
    __assert_fail("dctx->refMultipleDDicts && dctx->ddictSet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x166,"void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *)");
  }
  if (dctx->ddict != (ZSTD_DDict *)0x0) {
    uVar1 = (dctx->fParams).dictID;
    local_2c = uVar1;
    XVar6 = ZSTD_XXH64(&local_2c,4,0);
    uVar8 = pZVar2->ddictPtrTableSize - 1;
    uVar4 = XVar6 & uVar8;
    do {
      uVar7 = uVar4;
      uVar5 = ZSTD_getDictID_fromDDict(pZVar2->ddictPtrTable[uVar7]);
      if (uVar5 == uVar1) break;
      uVar4 = (uVar7 & uVar8) + 1;
    } while (uVar5 != 0);
    pZVar3 = pZVar2->ddictPtrTable[uVar7];
    if (pZVar3 != (ZSTD_DDict *)0x0) {
      ZSTD_freeDDict(dctx->ddictLocal);
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      dctx->dictID = (dctx->fParams).dictID;
      dctx->ddict = pZVar3;
      dctx->dictUses = ZSTD_use_indefinitely;
    }
  }
  return;
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}